

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void ns_read_from_socket(ns_connection *conn)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  socklen_t len;
  char buf [2048];
  socklen_t local_82c;
  int local_828 [514];
  
  if ((conn->flags & 8) == 0) {
    sVar3 = recv(conn->sock,local_828,0x800,0);
    local_82c = (socklen_t)sVar3;
    if (0 < (int)local_82c) {
      do {
        iobuf_append(&conn->recv_iobuf,local_828,(ulong)((uint)sVar3 & 0x7fffffff));
        ns_call(conn,3,&local_82c);
        sVar3 = recv(conn->sock,local_828,0x800,0);
        local_82c = (socklen_t)sVar3;
      } while (0 < (int)local_82c);
    }
    iVar1 = ns_is_error(local_82c);
    if (iVar1 != 0) {
      *(byte *)&conn->flags = (byte)conn->flags | 0x10;
    }
  }
  else {
    local_828[0] = 1;
    local_82c = 4;
    getsockopt(conn->sock,1,4,local_828,&local_82c);
    uVar2 = conn->flags & 0xfffffff7;
    conn->flags = uVar2;
    if (local_828[0] != 0) {
      conn->flags = uVar2 | 0x10;
    }
    ns_call(conn,2,local_828);
  }
  return;
}

Assistant:

static void ns_read_from_socket(struct ns_connection *conn) {
  char buf[2048];
  int n = 0;

  if (conn->flags & NSF_CONNECTING) {
    int ok = 1, ret;
    socklen_t len = sizeof(ok);

    ret = getsockopt(conn->sock, SOL_SOCKET, SO_ERROR, (char *) &ok, &len);
    (void) ret;
#ifdef NS_ENABLE_SSL
    if (ret == 0 && ok == 0 && conn->ssl != NULL) {
      int res = SSL_connect(conn->ssl);
      int ssl_err = ns_ssl_err(conn, res);
      if (res == 1) {
        conn->flags |= NSF_SSL_HANDSHAKE_DONE;
      } else if (ssl_err == SSL_ERROR_WANT_READ ||
                 ssl_err == SSL_ERROR_WANT_WRITE) {
        return; // Call us again
      } else {
        ok = 1;
      }
    }
#endif
    conn->flags &= ~NSF_CONNECTING;
    DBG(("%p ok=%d", conn, ok));
    if (ok != 0) {
      conn->flags |= NSF_CLOSE_IMMEDIATELY;
    }
    ns_call(conn, NS_CONNECT, &ok);
    return;
  }

#ifdef NS_ENABLE_SSL
  if (conn->ssl != NULL) {
    if (conn->flags & NSF_SSL_HANDSHAKE_DONE) {
      // SSL library may have more bytes ready to read then we ask to read.
      // Therefore, read in a loop until we read everything. Without the loop,
      // we skip to the next select() cycle which can just timeout.
      while ((n = SSL_read(conn->ssl, buf, sizeof(buf))) > 0) {
        DBG(("%p %d <- %d bytes (SSL)", conn, conn->flags, n));
        iobuf_append(&conn->recv_iobuf, buf, n);
        ns_call(conn, NS_RECV, &n);
      }
      ns_ssl_err(conn, n);
    } else {
      int res = SSL_accept(conn->ssl);
      int ssl_err = ns_ssl_err(conn, res);
      if (res == 1) {
        conn->flags |= NSF_SSL_HANDSHAKE_DONE;
      } else if (ssl_err == SSL_ERROR_WANT_READ ||
                 ssl_err == SSL_ERROR_WANT_WRITE) {
        return; // Call us again
      } else {
        conn->flags |= NSF_CLOSE_IMMEDIATELY;
      }
      return;
    }
  } else
#endif
  {
    while ((n = (int) recv(conn->sock, buf, sizeof(buf), 0)) > 0) {
      DBG(("%p %d <- %d bytes (PLAIN)", conn, conn->flags, n));
      iobuf_append(&conn->recv_iobuf, buf, n);
      ns_call(conn, NS_RECV, &n);
    }
  }

  if (ns_is_error(n)) {
    conn->flags |= NSF_CLOSE_IMMEDIATELY;
  }
}